

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.h
# Opt level: O0

void __thiscall HighsLp::~HighsLp(HighsLp *this)

{
  HighsLpMods *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  HighsLpMods::~HighsLpMods(in_RDI);
  HighsScale::~HighsScale((HighsScale *)in_RDI);
  HighsNameHash::~HighsNameHash((HighsNameHash *)0x17ece1);
  HighsNameHash::~HighsNameHash((HighsNameHash *)0x17ecf2);
  CLI::std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)unaff_retaddr);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::__cxx11::string::~string((string *)&in_RDI->save_inf_cost_variable_upper);
  std::__cxx11::string::~string((string *)&in_RDI->field_0x100);
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_RDI);
  CLI::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

HighsLp() { clear(); }